

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O0

void __thiscall
OpenMD::BondOrderParameter::writeOrderParameter
          (BondOrderParameter *this,vector<double,_std::allocator<double>_> *Q,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *What)

{
  int iVar1;
  byte bVar2;
  char *pcVar3;
  reference pvVar4;
  undefined8 uVar5;
  ostream *poVar6;
  string *psVar7;
  ulong uVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  StaticAnalyser *in_RDI;
  double dVar11;
  int l_3;
  RealType Wval;
  int i_1;
  int l_2;
  ofstream osw;
  int l_1;
  RealType Qval;
  int i;
  int l;
  ofstream osq;
  Revision rev;
  int *in_stack_fffffffffffff8c8;
  string *this_00;
  Revision *in_stack_fffffffffffff8e8;
  char *in_stack_fffffffffffff8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f8;
  key_type *in_stack_fffffffffffff908;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *in_stack_fffffffffffff910;
  Revision *in_stack_fffffffffffff938;
  string local_570 [36];
  pair<int,_int> local_54c;
  int local_544;
  double local_540;
  int local_538;
  int local_534;
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  ostream local_4d0 [512];
  string local_2d0 [36];
  pair<int,_int> local_2ac;
  int local_2a4;
  double local_2a0;
  int local_298;
  int local_294;
  string local_290 [32];
  string local_270 [48];
  string local_240 [32];
  ostream local_220 [544];
  
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_220,pcVar3,_S_out);
  std::__cxx11::string::~string(local_240);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    uVar5 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",uVar5);
    std::__cxx11::string::~string(local_2d0);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar6 = std::operator<<(local_220,"# ");
    psVar7 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(local_220,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff938);
    poVar6 = std::operator<<(poVar6,local_270);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_270);
    poVar6 = std::operator<<(local_220,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff8e8);
    poVar6 = std::operator<<(poVar6,local_290);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_290);
    poVar6 = std::operator<<(local_220,"# selection script: \"");
    poVar6 = std::operator<<(poVar6,(string *)&in_RDI[1].info_);
    std::operator<<(poVar6,"\"\n");
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      poVar6 = std::operator<<(local_220,"# parameters: ");
      poVar6 = std::operator<<(poVar6,(string *)&in_RDI->paramString_);
      std::operator<<(poVar6,"\n");
    }
    for (local_294 = 0; local_294 < 0xd; local_294 = local_294 + 1) {
      poVar6 = std::operator<<(local_220,"# <Q_");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_294);
      poVar6 = std::operator<<(poVar6,">: ");
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_294);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar4);
      std::operator<<(poVar6,"\n");
    }
    for (local_298 = 0; local_298 < *(int *)((long)&in_RDI[9].info_ + 4); local_298 = local_298 + 1)
    {
      local_2a0 = ((double)local_298 + 0.5) *
                  (double)in_RDI[9].outputTypes_.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                  (double)in_RDI[9].data_.
                          super__Vector_base<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
      std::ostream::operator<<(local_220,local_2a0);
      for (local_2a4 = 0; local_2a4 < 0xd; local_2a4 = local_2a4 + 1) {
        poVar6 = std::operator<<(local_220,"\t");
        local_2ac = std::make_pair<int&,int&>(in_stack_fffffffffffff8c8,(int *)0x13ed9b);
        pmVar9 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        iVar1 = *pmVar9;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             &in_RDI[9].outputTypes_.
                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(long)local_2a4);
        std::ostream::operator<<
                  (poVar6,((double)iVar1 / (double)*pvVar10) /
                          (double)in_RDI[9].outputTypes_.
                                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      }
      std::operator<<(local_220,"\n");
    }
    std::ofstream::close();
  }
  StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
  std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_4d0,pcVar3,_S_out);
  std::__cxx11::string::~string(local_4f0);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    StaticAnalyser::getOutputFileName_abi_cxx11_(in_RDI);
    std::operator+(in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    this_00 = local_570;
    uVar5 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",uVar5);
    std::__cxx11::string::~string(this_00);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar6 = std::operator<<(local_4d0,"# ");
    psVar7 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(local_4d0,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffff938);
    poVar6 = std::operator<<(poVar6,local_510);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_510);
    poVar6 = std::operator<<(local_4d0,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffff8e8);
    poVar6 = std::operator<<(poVar6,local_530);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_530);
    poVar6 = std::operator<<(local_4d0,"# selection script: \"");
    poVar6 = std::operator<<(poVar6,(string *)&in_RDI[1].info_);
    std::operator<<(poVar6,"\"\n");
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      poVar6 = std::operator<<(local_4d0,"# parameters: ");
      poVar6 = std::operator<<(poVar6,(string *)&in_RDI->paramString_);
      std::operator<<(poVar6,"\n");
    }
    for (local_534 = 0; local_534 < 0xd; local_534 = local_534 + 1) {
      poVar6 = std::operator<<(local_4d0,"# <W_");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_534);
      poVar6 = std::operator<<(poVar6,">: ");
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (in_RDX,(long)local_534);
      dVar11 = std::real<double>((complex<double> *)0x13f2ec);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar11);
      poVar6 = std::operator<<(poVar6,"\t");
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (in_RDX,(long)local_534);
      in_stack_fffffffffffff910 =
           (map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
            *)std::imag<double>((complex<double> *)0x13f340);
      in_stack_fffffffffffff908 =
           (key_type *)std::ostream::operator<<(poVar6,(double)in_stack_fffffffffffff910);
      std::operator<<((ostream *)in_stack_fffffffffffff908,"\n");
    }
    for (local_538 = 0; local_538 < *(int *)((long)&in_RDI[9].info_ + 4); local_538 = local_538 + 1)
    {
      local_540 = ((double)local_538 + 0.5) * *(double *)&in_RDI[10].outputFilename_.field_2 +
                  *(double *)&in_RDI[10].outputFilename_;
      std::ostream::operator<<(local_4d0,local_540);
      for (local_544 = 0; local_544 < 0xd; local_544 = local_544 + 1) {
        poVar6 = std::operator<<(local_4d0,"\t");
        local_54c = std::make_pair<int&,int&>(in_stack_fffffffffffff8c8,(int *)0x13f462);
        pmVar9 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        iVar1 = *pmVar9;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             ((long)&in_RDI[10].outputFilename_.field_2 + 8),(long)local_544);
        std::ostream::operator<<
                  (poVar6,((double)iVar1 / (double)*pvVar10) /
                          *(double *)&in_RDI[10].outputFilename_.field_2);
      }
      std::operator<<(local_4d0,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_4d0);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void BondOrderParameter::writeOrderParameter(std::vector<RealType> Q,
                                               std::vector<ComplexType> What) {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "q").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osq << "# <Q_" << l << ">: " << Q[l] << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Qval = MinQ_ + (i + 0.5) * deltaQ_;
        osq << Qval;
        for (int l = 0; l <= lMax_; l++) {
          osq << "\t"
              << (RealType)Q_histogram_[std::make_pair(i, l)] /
                     (RealType)Qcount_[l] / deltaQ_;
        }
        osq << "\n";
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "w").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osw << "# <W_" << l << ">: " << real(What[l]) << "\t" << imag(What[l])
            << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Wval = MinW_ + (i + 0.5) * deltaW_;
        osw << Wval;
        for (int l = 0; l <= lMax_; l++) {
          osw << "\t"
              << (RealType)W_histogram_[std::make_pair(i, l)] /
                     (RealType)Wcount_[l] / deltaW_;
        }
        osw << "\n";
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }